

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>
::dx(FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>
     *this,int i)

{
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *pFVar1;
  Fad<double> *pFVar2;
  Fad<double> *pFVar3;
  double *pdVar4;
  double *pdVar5;
  
  pFVar1 = (this->left_->fadexpr_).right_;
  pFVar2 = (((this->left_->fadexpr_).left_)->fadexpr_).expr_;
  pdVar5 = &pFVar2->defaultVal;
  if ((pFVar2->dx_).num_elts != 0) {
    pdVar5 = (pFVar2->dx_).ptr_to_data + i;
  }
  pFVar3 = (pFVar1->fadexpr_).right_;
  pdVar4 = &pFVar3->defaultVal;
  if ((pFVar3->dx_).num_elts != 0) {
    pdVar4 = (pFVar3->dx_).ptr_to_data + i;
  }
  return (*pdVar4 * pFVar2->val_ - ((pFVar1->fadexpr_).left_.constant_ - pFVar3->val_) * *pdVar5) /
         (this->right_).constant_;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) / right_.val();}